

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblebridgeutils.cpp
# Opt level: O1

bool QAccessibleBridgeUtils::performEffectiveAction(QAccessibleInterface *iface,QString *actionName)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  QString *pQVar6;
  undefined4 extraout_var_00;
  bool bVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  bool success;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_30;
  long *plVar5;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (iface != (QAccessibleInterface *)0x0) {
    iVar4 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,3);
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x10))(&local_58,plVar5);
      QVar10.m_data = (actionName->d).ptr;
      QVar10.m_size = (actionName->d).size;
      cVar3 = QtPrivate::QStringList_contains((QList_conflict *)local_58.data,QVar10,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_58);
      if (cVar3 != '\0') {
        (**(code **)(*plVar5 + 0x28))(plVar5,actionName);
        bVar7 = true;
        goto LAB_00593e16;
      }
    }
    pQVar6 = QAccessibleActionInterface::increaseAction();
    lVar1 = (actionName->d).size;
    lVar2 = (pQVar6->d).size;
    if ((lVar1 != lVar2) ||
       (QVar8.m_data = (actionName->d).ptr, QVar8.m_size = lVar1, QVar11.m_data = (pQVar6->d).ptr,
       QVar11.m_size = lVar2, cVar3 = QtPrivate::equalStrings(QVar8,QVar11), cVar3 == '\0')) {
      pQVar6 = QAccessibleActionInterface::decreaseAction();
      lVar1 = (actionName->d).size;
      lVar2 = (pQVar6->d).size;
      if ((lVar1 != lVar2) ||
         (QVar9.m_data = (actionName->d).ptr, QVar9.m_size = lVar1, QVar12.m_data = (pQVar6->d).ptr,
         QVar12.m_size = lVar2, cVar3 = QtPrivate::equalStrings(QVar9,QVar12), cVar3 == '\0'))
      goto LAB_00593e14;
    }
    iVar4 = (*iface->_vptr_QAccessibleInterface[0x14])(iface,2);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
    if (plVar5 != (long *)0x0) {
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      uStack_40 = 0xaaaaaaaa;
      uStack_3c = 0xaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      (**(code **)(*plVar5 + 0x10))(&local_58,plVar5);
      (**(code **)(*plVar5 + 0x30))(&local_78,plVar5);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      (**(code **)(*plVar5 + 0x28))(&local_78,plVar5);
      ::QVariant::toDouble((bool *)&local_78);
      ::QVariant::~QVariant(&local_78);
      bVar7 = false;
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_00593e16;
    }
  }
LAB_00593e14:
  bVar7 = false;
LAB_00593e16:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool performEffectiveAction(QAccessibleInterface *iface, const QString &actionName)
{
    if (!iface)
        return false;
    if (performAction(iface, actionName))
        return true;
    if (actionName != QAccessibleActionInterface::increaseAction()
        && actionName != QAccessibleActionInterface::decreaseAction())
        return false;

    QAccessibleValueInterface *valueIface = iface->valueInterface();
    if (!valueIface)
        return false;
    bool success;
    const QVariant currentVariant = valueIface->currentValue();
    double stepSize = valueIface->minimumStepSize().toDouble(&success);
    if (!success || qFuzzyIsNull(stepSize)) {
        const double min = valueIface->minimumValue().toDouble(&success);
        if (!success)
            return false;
        const double max = valueIface->maximumValue().toDouble(&success);
        if (!success)
            return false;
        stepSize = (max - min) / 10;  // this is pretty arbitrary, we just need to provide something
        const int typ = currentVariant.userType();
        if (typ != QMetaType::Float && typ != QMetaType::Double) {
            // currentValue is an integer. Round it up to ensure stepping in case it was below 1
            stepSize = qCeil(stepSize);
        }
    }
    const double current = currentVariant.toDouble(&success);
    if (!success)
        return false;
    if (actionName == QAccessibleActionInterface::decreaseAction())
        stepSize = -stepSize;
    valueIface->setCurrentValue(current + stepSize);
    return true;
}